

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

vector<soul::Value,_std::allocator<soul::Value>_> * __thiscall
soul::heart::Parser::parseConstantList
          (vector<soul::Value,_std::allocator<soul::Value>_> *__return_storage_ptr__,Parser *this,
          Type *requiredType,size_t num)

{
  size_type sVar1;
  Value local_88;
  char *local_48;
  undefined1 local_29;
  size_type local_28;
  size_t num_local;
  Type *requiredType_local;
  Parser *this_local;
  vector<soul::Value,_std::allocator<soul::Value>_> *elements;
  
  local_29 = 0;
  local_28 = num;
  num_local = (size_t)requiredType;
  requiredType_local = (Type *)this;
  this_local = (Parser *)__return_storage_ptr__;
  std::vector<soul::Value,_std::allocator<soul::Value>_>::vector(__return_storage_ptr__);
  std::vector<soul::Value,_std::allocator<soul::Value>_>::reserve(__return_storage_ptr__,local_28);
  while (sVar1 = std::vector<soul::Value,_std::allocator<soul::Value>_>::size
                           (__return_storage_ptr__), sVar1 != local_28) {
    parseConstant(&local_88,this,(Type *)num_local,true);
    std::vector<soul::Value,_std::allocator<soul::Value>_>::push_back
              (__return_storage_ptr__,&local_88);
    soul::Value::~Value(&local_88);
    sVar1 = std::vector<soul::Value,_std::allocator<soul::Value>_>::size(__return_storage_ptr__);
    if (sVar1 < local_28) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)",");
    }
  }
  local_48 = "}";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x54ceac);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Value> parseConstantList (const Type& requiredType, size_t num)
    {
        std::vector<Value> elements;
        elements.reserve (num);

        for (;;)
        {
            if (elements.size() == num)
            {
                expect (HEARTOperator::closeBrace);
                return elements;
            }

            elements.push_back (parseConstant (requiredType, true));

            if (elements.size() < num)
                expect (HEARTOperator::comma);
        }
    }